

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# deconvolution_x86.cpp
# Opt level: O3

int __thiscall
ncnn::Deconvolution_x86::forward(Deconvolution_x86 *this,Mat *bottom_blob,Mat *top_blob,Option *opt)

{
  float *pfVar1;
  float *pfVar2;
  float *pfVar3;
  float *pfVar4;
  undefined4 uVar5;
  undefined4 uVar6;
  int iVar7;
  int iVar8;
  int iVar9;
  uint uVar10;
  uint uVar11;
  undefined4 uVar12;
  uint uVar13;
  uint uVar14;
  int *piVar15;
  void *pvVar16;
  size_t sVar17;
  size_t sVar18;
  size_t sVar19;
  size_t sVar20;
  _func_int **pp_Var21;
  _func_int **pp_Var22;
  undefined1 auVar23 [16];
  undefined1 auVar24 [16];
  undefined1 auVar25 [16];
  undefined1 auVar26 [16];
  undefined1 auVar27 [16];
  undefined1 auVar28 [16];
  undefined1 auVar29 [16];
  undefined1 auVar30 [16];
  undefined1 auVar31 [16];
  undefined4 uVar32;
  undefined4 uVar33;
  undefined4 uVar34;
  undefined4 uVar35;
  undefined1 auVar36 [16];
  undefined1 auVar37 [16];
  void *pvVar38;
  int iVar39;
  int iVar40;
  int iVar41;
  int iVar42;
  int iVar43;
  int iVar44;
  long lVar45;
  _func_int *p_Var46;
  int iVar47;
  uint uVar48;
  _func_int *p_Var49;
  long lVar50;
  ulong uVar51;
  int w;
  int w_1;
  ulong uVar52;
  _func_int **pp_Var53;
  long lVar54;
  ulong uVar55;
  void *pvVar56;
  ulong uVar57;
  undefined1 (*pauVar58) [16];
  void *pvVar59;
  int y_1;
  uint uVar60;
  int iVar61;
  int y;
  int iVar62;
  int iVar63;
  ulong uVar64;
  ulong uVar65;
  int iVar66;
  float fVar67;
  float fVar68;
  float fVar69;
  v4sf one;
  float fVar70;
  float fVar71;
  float fVar83;
  undefined1 auVar72 [16];
  undefined1 auVar73 [16];
  undefined1 auVar74 [16];
  undefined1 auVar75 [16];
  undefined1 auVar76 [16];
  undefined1 auVar77 [16];
  undefined1 auVar78 [16];
  undefined1 auVar79 [16];
  undefined1 auVar80 [16];
  undefined1 auVar81 [16];
  undefined1 auVar82 [16];
  undefined1 auVar84 [12];
  undefined1 auVar85 [16];
  undefined1 auVar86 [16];
  undefined1 auVar87 [16];
  undefined1 auVar88 [16];
  undefined1 auVar89 [16];
  float fVar90;
  float fVar91;
  float fVar92;
  float fVar93;
  float fVar94;
  float fVar95;
  float fVar96;
  float fVar97;
  float fVar98;
  float fVar99;
  undefined1 auVar100 [16];
  undefined1 auVar101 [16];
  int outh_1;
  int h_1;
  int outw;
  int outh;
  int h;
  void *local_198;
  long local_190;
  long local_178;
  uint local_16c;
  long local_168;
  float *local_148;
  ulong local_f8;
  undefined1 local_e8 [64];
  int local_a8;
  undefined1 auStack_a4 [12];
  Mat local_98;
  ulong local_50;
  _func_int **local_48;
  Option *local_40;
  long local_38;
  
  iVar7 = bottom_blob->w;
  iVar8 = bottom_blob->h;
  uVar57 = bottom_blob->elemsize;
  iVar9 = bottom_blob->elempack;
  p_Var46 = this->_vptr_Deconvolution_x86[-3];
  local_16c = 1;
  if (opt->use_packing_layout == true) {
    local_16c = (uint)(((&this->field_0xd0)[(long)p_Var46] & 3) == 0) * 3 + 1;
  }
  iVar62 = *(int *)(&this->field_0xd4 + (long)p_Var46);
  iVar44 = *(int *)(&this->field_0xe4 + (long)p_Var46);
  iVar47 = (*(int *)(&this->field_0xd8 + (long)p_Var46) + -1) *
           *(int *)(&this->field_0xe0 + (long)p_Var46);
  iVar66 = *(int *)(&this->field_0xdc + (long)p_Var46);
  iVar63 = *(int *)(&this->field_0xe8 + (long)p_Var46);
  iVar43 = *(int *)(&this->field_0xfc + (long)p_Var46);
  iVar61 = *(int *)(&this->field_0x100 + (long)p_Var46);
  local_98.cstep = 0;
  local_98.data = (void *)0x0;
  local_98.refcount._0_4_ = 0;
  local_98.refcount._4_4_ = 0;
  local_98.elemsize._0_4_ = 0;
  local_98.elemsize._4_4_ = 0;
  local_98.elempack = 0;
  local_98.allocator = (Allocator *)0x0;
  local_98.dims = 0;
  local_98.w = 0;
  local_98.h = 0;
  local_98.d = 0;
  local_98.c = 0;
  p_Var49 = this->_vptr_Deconvolution_x86[-3];
  p_Var46 = (_func_int *)((long)&this->_vptr_Deconvolution_x86 + (long)p_Var49);
  lVar54 = 0x10;
  if (((((*(int *)(&this->field_0xec + (long)p_Var49) < 1) && (*(int *)(p_Var46 + 0xf0) < 1)) &&
       (*(int *)(p_Var46 + 0xf4) < 1)) && (*(int *)(p_Var46 + 0xf8) < 1)) &&
     ((*(int *)(p_Var46 + 0x104) < 1 || (*(int *)(p_Var46 + 0x108) < 1)))) {
    if (&local_98 != top_blob) {
      piVar15 = top_blob->refcount;
      if (piVar15 != (int *)0x0) {
        LOCK();
        *piVar15 = *piVar15 + 1;
        UNLOCK();
      }
      local_98.data = top_blob->data;
      local_98.refcount._0_4_ = SUB84(top_blob->refcount,0);
      local_98.refcount._4_4_ = (undefined4)((ulong)top_blob->refcount >> 0x20);
      local_98.elemsize._0_4_ = (undefined4)top_blob->elemsize;
      local_98.elemsize._4_4_ = (undefined4)(top_blob->elemsize >> 0x20);
      local_98.elempack = top_blob->elempack;
      local_98.allocator = top_blob->allocator;
      uVar32 = top_blob->dims;
      uVar33 = top_blob->w;
      uVar34 = top_blob->h;
      uVar35 = top_blob->d;
      local_98.c = top_blob->c;
      local_98.cstep = top_blob->cstep;
      p_Var49 = this->_vptr_Deconvolution_x86[-3];
      local_98.dims = uVar32;
      local_98.w = uVar33;
      local_98.h = uVar34;
      local_98.d = uVar35;
    }
    p_Var46 = (_func_int *)((long)&this->_vptr_Deconvolution_x86 + (long)p_Var49);
    lVar54 = 8;
  }
  iVar66 = (iVar62 + -1) * iVar66;
  local_50 = CONCAT44(local_50._4_4_,iVar66);
  local_40 = opt;
  Mat::create(&local_98,iVar43 + (iVar7 + -1) * iVar44 + iVar66 + 1,
              iVar61 + (iVar8 + -1) * iVar63 + iVar47 + 1,*(int *)(p_Var46 + 0xd0) / (int)local_16c,
              (uVar57 / (ulong)(long)iVar9) * (ulong)local_16c,local_16c,
              *(Allocator **)(&opt->lightmode + lVar54));
  iVar8 = local_98.h;
  iVar7 = local_98.w;
  pvVar38 = local_98.data;
  auVar37 = _DAT_00517220;
  auVar31 = _DAT_005171f0;
  auVar85 = _DAT_005171e0;
  iVar62 = -100;
  if ((local_98.data == (void *)0x0) || (local_98.cstep * (long)local_98.c == 0)) goto LAB_0029b2d4;
  local_48 = this->_vptr_Deconvolution_x86;
  p_Var46 = local_48[-3];
  uVar10 = *(uint *)(&this->field_0xd4 + (long)p_Var46);
  uVar11 = *(uint *)(&this->field_0xd8 + (long)p_Var46);
  if ((iVar9 == 4) && (local_16c == 4)) {
    if (0 < local_98.c) {
      iVar62 = *(int *)(&this->field_0xdc + (long)p_Var46);
      iVar44 = *(int *)(&this->field_0xe0 + (long)p_Var46);
      iVar66 = *(int *)(&this->field_0xe4 + (long)p_Var46);
      iVar63 = *(int *)(&this->field_0xe8 + (long)p_Var46);
      uVar12 = *(undefined4 *)(&this->field_0x114 + (long)p_Var46);
      lVar54 = *(long *)(&this->field_0x1a8 + (long)p_Var46);
      local_178 = 0;
      fVar67 = (float)DAT_00517220;
      fVar68 = DAT_00517220._4_4_;
      fVar69 = DAT_00517220._8_4_;
      fVar70 = DAT_00517220._12_4_;
      do {
        if (0 < local_98.h) {
          iVar43 = bottom_blob->w;
          iVar61 = bottom_blob->h;
          pauVar58 = (undefined1 (*) [16])
                     (local_98.cstep * local_178 *
                      CONCAT44(local_98.elemsize._4_4_,(undefined4)local_98.elemsize) +
                     (long)local_98.data);
          uVar13 = bottom_blob->c;
          auVar77._12_4_ = 0;
          auVar77._0_12_ = local_e8._4_12_;
          local_e8._0_16_ = auVar77 << 0x20;
          do {
            if (0 < local_98.w) {
              uVar48 = 0;
              local_a8 = (1 - uVar10) * iVar62;
              do {
                auVar77 = ZEXT816(0);
                if (lVar54 == 0) {
                  auVar86 = ZEXT816(0);
                }
                else {
                  auVar86 = *(undefined1 (*) [16])(lVar54 + local_178 * 0x10);
                }
                if (0 < (int)uVar13) {
                  pvVar59 = (void *)((this->weight_data_tm).cstep * local_178 *
                                     (this->weight_data_tm).elemsize +
                                    (long)(this->weight_data_tm).data);
                  pvVar16 = bottom_blob->data;
                  uVar57 = 0;
                  do {
                    if (0 < (int)uVar11) {
                      uVar65 = 0;
                      uVar64 = 0;
                      do {
                        iVar39 = (((int)uVar64 - uVar11) + 1) * iVar44 + local_e8._0_4_;
                        if ((((-1 < iVar39) && (iVar40 = iVar39 / iVar63, iVar39 % iVar63 == 0)) &&
                            (0 < (int)uVar10)) && (iVar40 < iVar61)) {
                          lVar50 = (long)iVar40 * (long)bottom_blob->w * bottom_blob->elemsize +
                                   bottom_blob->cstep * bottom_blob->elemsize * uVar57;
                          uVar52 = uVar65;
                          uVar55 = (ulong)uVar10;
                          iVar39 = local_a8;
                          do {
                            if (((-1 < iVar39) && (iVar40 = iVar39 / iVar66, iVar39 % iVar66 == 0))
                               && (iVar40 < iVar43)) {
                              lVar45 = (long)(iVar40 << 2);
                              fVar71 = *(float *)((long)pvVar16 + lVar45 * 4 + lVar50);
                              fVar91 = *(float *)((long)pvVar16 + lVar45 * 4 + lVar50 + 4);
                              uVar51 = uVar52 & 0xffffffff;
                              pfVar1 = (float *)((long)pvVar59 + uVar51 * 4);
                              fVar83 = *(float *)((long)pvVar16 + lVar45 * 4 + lVar50 + 8);
                              fVar96 = auVar86._4_4_;
                              fVar97 = auVar86._8_4_;
                              fVar98 = auVar86._12_4_;
                              fVar93 = *(float *)((long)pvVar16 + lVar45 * 4 + lVar50 + 0xc);
                              pfVar2 = (float *)((long)pvVar59 + uVar51 * 4 + 0x10);
                              pfVar3 = (float *)((long)pvVar59 + uVar51 * 4 + 0x20);
                              pfVar4 = (float *)((long)pvVar59 + uVar51 * 4 + 0x30);
                              auVar86._0_4_ =
                                   fVar93 * *pfVar4 +
                                   fVar83 * *pfVar3 + fVar91 * *pfVar2 +
                                   fVar71 * *pfVar1 + auVar86._0_4_;
                              auVar86._4_4_ =
                                   fVar93 * pfVar4[1] +
                                   fVar83 * pfVar3[1] + fVar91 * pfVar2[1] +
                                   fVar71 * pfVar1[1] + fVar96;
                              auVar86._8_4_ =
                                   fVar93 * pfVar4[2] +
                                   fVar83 * pfVar3[2] + fVar91 * pfVar2[2] +
                                   fVar71 * pfVar1[2] + fVar97;
                              auVar86._12_4_ =
                                   fVar93 * pfVar4[3] +
                                   fVar83 * pfVar3[3] + fVar91 * pfVar2[3] +
                                   fVar71 * pfVar1[3] + fVar98;
                            }
                            uVar52 = uVar52 + 0x10;
                            iVar39 = iVar39 + iVar62;
                            uVar55 = uVar55 - 1;
                          } while (uVar55 != 0);
                        }
                        uVar64 = uVar64 + 1;
                        uVar65 = uVar65 + (ulong)uVar10 * 0x10;
                      } while (uVar64 != uVar11);
                    }
                    pvVar59 = (void *)((long)pvVar59 + (long)(int)(uVar10 * uVar11 * 0x10) * 4);
                    uVar57 = uVar57 + 1;
                  } while (uVar57 != uVar13);
                }
                fVar71 = auVar86._0_4_;
                fVar91 = auVar86._4_4_;
                fVar83 = auVar86._8_4_;
                fVar93 = auVar86._12_4_;
                switch(uVar12) {
                case 1:
                  auVar86 = maxps(auVar86,auVar77);
                  break;
                case 2:
                  auVar76 = maxps(auVar86,auVar77);
                  auVar77 = minps(auVar86,auVar77);
                  fVar71 = **(float **)(&this->field_0x118 + (long)p_Var46);
                  auVar86._4_4_ = fVar71 * auVar77._4_4_ + auVar76._4_4_;
                  auVar86._0_4_ = fVar71 * auVar77._0_4_ + auVar76._0_4_;
                  auVar86._8_4_ = fVar71 * auVar77._8_4_ + auVar76._8_4_;
                  auVar86._12_4_ = fVar71 * auVar77._12_4_ + auVar76._12_4_;
                  break;
                case 3:
                  uVar5 = **(undefined4 **)(&this->field_0x118 + (long)p_Var46);
                  uVar6 = (*(undefined4 **)(&this->field_0x118 + (long)p_Var46))[1];
                  auVar74._4_4_ = uVar5;
                  auVar74._0_4_ = uVar5;
                  auVar74._8_4_ = uVar5;
                  auVar74._12_4_ = uVar5;
                  auVar77 = maxps(auVar86,auVar74);
                  auVar26._4_4_ = uVar6;
                  auVar26._0_4_ = uVar6;
                  auVar26._8_4_ = uVar6;
                  auVar26._12_4_ = uVar6;
                  auVar86 = minps(auVar77,auVar26);
                  break;
                case 4:
                  auVar87._0_8_ = auVar86._0_8_ ^ 0x8000000080000000;
                  auVar87._8_4_ = -fVar83;
                  auVar87._12_4_ = -fVar93;
                  auVar77 = minps(auVar87,auVar85);
                  auVar77 = maxps(auVar77,auVar31);
                  fVar91 = auVar77._0_4_ * 1.442695 + 0.5;
                  fVar93 = auVar77._4_4_ * 1.442695 + 0.5;
                  fVar97 = auVar77._8_4_ * 1.442695 + 0.5;
                  fVar99 = auVar77._12_4_ * 1.442695 + 0.5;
                  fVar71 = (float)(int)fVar91;
                  fVar83 = (float)(int)fVar93;
                  fVar96 = (float)(int)fVar97;
                  fVar98 = (float)(int)fVar99;
                  fVar71 = fVar71 - (float)(-(uint)(fVar91 < fVar71) & (uint)fVar67);
                  fVar83 = fVar83 - (float)(-(uint)(fVar93 < fVar83) & (uint)fVar68);
                  fVar96 = fVar96 - (float)(-(uint)(fVar97 < fVar96) & (uint)fVar69);
                  fVar98 = fVar98 - (float)(-(uint)(fVar99 < fVar98) & (uint)fVar70);
                  fVar91 = fVar71 * -0.6931472 + auVar77._0_4_;
                  fVar93 = fVar83 * -0.6931472 + auVar77._4_4_;
                  fVar97 = fVar96 * -0.6931472 + auVar77._8_4_;
                  fVar99 = fVar98 * -0.6931472 + auVar77._12_4_;
                  auVar75._0_4_ =
                       fVar91 + fVar67 +
                       (((((fVar91 * 0.00019875691 + 0.0013981999) * fVar91 + 0.008333452) * fVar91
                         + 0.041665796) * fVar91 + 0.16666666) * fVar91 + 0.5) * fVar91 * fVar91;
                  auVar75._4_4_ =
                       fVar93 + fVar68 +
                       (((((fVar93 * 0.00019875691 + 0.0013981999) * fVar93 + 0.008333452) * fVar93
                         + 0.041665796) * fVar93 + 0.16666666) * fVar93 + 0.5) * fVar93 * fVar93;
                  auVar75._8_4_ =
                       fVar97 + fVar69 +
                       (((((fVar97 * 0.00019875691 + 0.0013981999) * fVar97 + 0.008333452) * fVar97
                         + 0.041665796) * fVar97 + 0.16666666) * fVar97 + 0.5) * fVar97 * fVar97;
                  auVar75._12_4_ =
                       fVar99 + fVar70 +
                       (((((fVar99 * 0.00019875691 + 0.0013981999) * fVar99 + 0.008333452) * fVar99
                         + 0.041665796) * fVar99 + 0.16666666) * fVar99 + 0.5) * fVar99 * fVar99;
                  fVar97 = (float)((int)fVar71 * 0x800000 + (int)fVar67) * auVar75._0_4_ + fVar67;
                  fVar99 = (float)((int)fVar83 * 0x800000 + (int)fVar68) * auVar75._4_4_ + fVar68;
                  fVar96 = (float)((int)fVar96 * 0x800000 + (int)fVar69) * auVar75._8_4_ + fVar69;
                  fVar98 = (float)((int)fVar98 * 0x800000 + (int)fVar70) * auVar75._12_4_ + fVar70;
                  auVar25._4_4_ = fVar99;
                  auVar25._0_4_ = fVar97;
                  auVar25._8_4_ = fVar96;
                  auVar25._12_4_ = fVar98;
                  auVar77 = rcpps(auVar75,auVar25);
                  fVar71 = auVar77._0_4_;
                  fVar91 = auVar77._4_4_;
                  fVar83 = auVar77._8_4_;
                  fVar93 = auVar77._12_4_;
                  auVar86._0_4_ = (fVar67 - fVar97 * fVar71) * fVar71 + fVar71;
                  auVar86._4_4_ = (fVar68 - fVar99 * fVar91) * fVar91 + fVar91;
                  auVar86._8_4_ = (fVar69 - fVar96 * fVar83) * fVar83 + fVar83;
                  auVar86._12_4_ = (fVar70 - fVar98 * fVar93) * fVar93 + fVar93;
                  break;
                case 5:
                  auVar77 = minps(auVar86,auVar85);
                  auVar77 = maxps(auVar77,auVar31);
                  fVar96 = auVar77._0_4_ * 1.442695 + 0.5;
                  fVar97 = auVar77._4_4_ * 1.442695 + 0.5;
                  fVar98 = auVar77._8_4_ * 1.442695 + 0.5;
                  fVar99 = auVar77._12_4_ * 1.442695 + 0.5;
                  fVar90 = (float)(int)fVar96;
                  fVar92 = (float)(int)fVar97;
                  fVar94 = (float)(int)fVar98;
                  fVar95 = (float)(int)fVar99;
                  fVar90 = fVar90 - (float)(-(uint)(fVar96 < fVar90) & (uint)fVar67);
                  fVar92 = fVar92 - (float)(-(uint)(fVar97 < fVar92) & (uint)fVar68);
                  fVar94 = fVar94 - (float)(-(uint)(fVar98 < fVar94) & (uint)fVar69);
                  fVar95 = fVar95 - (float)(-(uint)(fVar99 < fVar95) & (uint)fVar70);
                  fVar96 = auVar77._0_4_ - fVar90 * 0.6931472;
                  fVar97 = auVar77._4_4_ - fVar92 * 0.6931472;
                  fVar98 = auVar77._8_4_ - fVar94 * 0.6931472;
                  fVar99 = auVar77._12_4_ - fVar95 * 0.6931472;
                  auVar100._0_4_ =
                       (float)((int)fVar90 * 0x800000 + (int)fVar67) *
                       (fVar96 + fVar67 +
                       (((((fVar96 * 0.00019875691 + 0.0013981999) * fVar96 + 0.008333452) * fVar96
                         + 0.041665796) * fVar96 + 0.16666666) * fVar96 + 0.5) * fVar96 * fVar96) +
                       fVar67;
                  auVar100._4_4_ =
                       (float)((int)fVar92 * 0x800000 + (int)fVar68) *
                       (fVar97 + fVar68 +
                       (((((fVar97 * 0.00019875691 + 0.0013981999) * fVar97 + 0.008333452) * fVar97
                         + 0.041665796) * fVar97 + 0.16666666) * fVar97 + 0.5) * fVar97 * fVar97) +
                       fVar68;
                  auVar100._8_4_ =
                       (float)((int)fVar94 * 0x800000 + (int)fVar69) *
                       (fVar98 + fVar69 +
                       (((((fVar98 * 0.00019875691 + 0.0013981999) * fVar98 + 0.008333452) * fVar98
                         + 0.041665796) * fVar98 + 0.16666666) * fVar98 + 0.5) * fVar98 * fVar98) +
                       fVar69;
                  auVar100._12_4_ =
                       (float)((int)fVar95 * 0x800000 + (int)fVar70) *
                       (fVar99 + fVar70 +
                       (((((fVar99 * 0.00019875691 + 0.0013981999) * fVar99 + 0.008333452) * fVar99
                         + 0.041665796) * fVar99 + 0.16666666) * fVar99 + 0.5) * fVar99 * fVar99) +
                       fVar70;
                  auVar77 = maxps(auVar100,_DAT_00517290);
                  fVar96 = (float)(auVar77._0_4_ & 0x807fffff | 0x3f000000);
                  fVar98 = (float)(auVar77._4_4_ & 0x807fffff | 0x3f000000);
                  fVar90 = (float)(auVar77._8_4_ & 0x807fffff | 0x3f000000);
                  fVar94 = (float)(auVar77._12_4_ & 0x807fffff | 0x3f000000);
                  fVar97 = fVar96 + -1.0 + (float)(-(uint)(fVar96 < 0.70710677) & (uint)fVar96);
                  fVar99 = fVar98 + -1.0 + (float)(-(uint)(fVar98 < 0.70710677) & (uint)fVar98);
                  fVar92 = fVar90 + -1.0 + (float)(-(uint)(fVar90 < 0.70710677) & (uint)fVar90);
                  fVar95 = fVar94 + -1.0 + (float)(-(uint)(fVar94 < 0.70710677) & (uint)fVar94);
                  auVar72._0_8_ =
                       CONCAT44(-(uint)(auVar100._4_4_ <= 0.0),-(uint)(auVar100._0_4_ <= 0.0)) &
                       0x7fffffff7fffffff;
                  auVar72._8_4_ = -(uint)(auVar100._8_4_ <= 0.0) & 0x7fffffff;
                  auVar72._12_4_ = -(uint)(auVar100._12_4_ <= 0.0) & 0x7fffffff;
                  auVar23._4_4_ =
                       ~-(uint)(auVar100._4_4_ <= 0.0) &
                       (uint)((((float)(int)((auVar77._4_4_ >> 0x17) - 0x7e) -
                               (float)(-(uint)(fVar98 < 0.70710677) & (uint)fVar68)) * 0.6931472 +
                               fVar99 + (((((((((fVar99 * 0.070376836 + -0.1151461) * fVar99 +
                                               0.116769984) * fVar99 + -0.12420141) * fVar99 +
                                             0.14249323) * fVar99 + -0.16668057) * fVar99 +
                                           0.20000714) * fVar99 + -0.24999994) * fVar99 + 0.3333333)
                                         * fVar99 + -0.5) * fVar99 * fVar99) * -2.0);
                  auVar23._0_4_ =
                       ~-(uint)(auVar100._0_4_ <= 0.0) &
                       (uint)((((float)(int)((auVar77._0_4_ >> 0x17) - 0x7e) -
                               (float)(-(uint)(fVar96 < 0.70710677) & (uint)fVar67)) * 0.6931472 +
                               fVar97 + (((((((((fVar97 * 0.070376836 + -0.1151461) * fVar97 +
                                               0.116769984) * fVar97 + -0.12420141) * fVar97 +
                                             0.14249323) * fVar97 + -0.16668057) * fVar97 +
                                           0.20000714) * fVar97 + -0.24999994) * fVar97 + 0.3333333)
                                         * fVar97 + -0.5) * fVar97 * fVar97) * -2.0);
                  auVar23._8_4_ =
                       ~-(uint)(auVar100._8_4_ <= 0.0) &
                       (uint)((((float)(int)((auVar77._8_4_ >> 0x17) - 0x7e) -
                               (float)(-(uint)(fVar90 < 0.70710677) & (uint)fVar69)) * 0.6931472 +
                               fVar92 + (((((((((fVar92 * 0.070376836 + -0.1151461) * fVar92 +
                                               0.116769984) * fVar92 + -0.12420141) * fVar92 +
                                             0.14249323) * fVar92 + -0.16668057) * fVar92 +
                                           0.20000714) * fVar92 + -0.24999994) * fVar92 + 0.3333333)
                                         * fVar92 + -0.5) * fVar92 * fVar92) * -2.0);
                  auVar23._12_4_ =
                       ~-(uint)(auVar100._12_4_ <= 0.0) &
                       (uint)((((float)(int)((auVar77._12_4_ >> 0x17) - 0x7e) -
                               (float)(-(uint)(fVar94 < 0.70710677) & (uint)fVar70)) * 0.6931472 +
                               fVar95 + (((((((((fVar95 * 0.070376836 + -0.1151461) * fVar95 +
                                               0.116769984) * fVar95 + -0.12420141) * fVar95 +
                                             0.14249323) * fVar95 + -0.16668057) * fVar95 +
                                           0.20000714) * fVar95 + -0.24999994) * fVar95 + 0.3333333)
                                         * fVar95 + -0.5) * fVar95 * fVar95) * -2.0);
                  auVar77 = minps(auVar72 | auVar23,auVar85);
                  auVar77 = maxps(auVar77,auVar31);
                  fVar96 = auVar77._0_4_ * 1.442695 + 0.5;
                  fVar97 = auVar77._4_4_ * 1.442695 + 0.5;
                  fVar98 = auVar77._8_4_ * 1.442695 + 0.5;
                  fVar99 = auVar77._12_4_ * 1.442695 + 0.5;
                  fVar90 = (float)(int)fVar96;
                  fVar92 = (float)(int)fVar97;
                  fVar94 = (float)(int)fVar98;
                  fVar95 = (float)(int)fVar99;
                  fVar90 = fVar90 - (float)(-(uint)(fVar96 < fVar90) & (uint)fVar67);
                  fVar92 = fVar92 - (float)(-(uint)(fVar97 < fVar92) & (uint)fVar68);
                  fVar94 = fVar94 - (float)(-(uint)(fVar98 < fVar94) & (uint)fVar69);
                  fVar95 = fVar95 - (float)(-(uint)(fVar99 < fVar95) & (uint)fVar70);
                  fVar96 = auVar77._0_4_ - fVar90 * 0.6931472;
                  fVar97 = auVar77._4_4_ - fVar92 * 0.6931472;
                  fVar98 = auVar77._8_4_ - fVar94 * 0.6931472;
                  fVar99 = auVar77._12_4_ - fVar95 * 0.6931472;
                  auVar73._0_4_ =
                       fVar96 + fVar67 +
                       (((((fVar96 * 0.00019875691 + 0.0013981999) * fVar96 + 0.008333452) * fVar96
                         + 0.041665796) * fVar96 + 0.16666666) * fVar96 + 0.5) * fVar96 * fVar96;
                  auVar73._4_4_ =
                       fVar97 + fVar68 +
                       (((((fVar97 * 0.00019875691 + 0.0013981999) * fVar97 + 0.008333452) * fVar97
                         + 0.041665796) * fVar97 + 0.16666666) * fVar97 + 0.5) * fVar97 * fVar97;
                  auVar73._8_4_ =
                       fVar98 + fVar69 +
                       (((((fVar98 * 0.00019875691 + 0.0013981999) * fVar98 + 0.008333452) * fVar98
                         + 0.041665796) * fVar98 + 0.16666666) * fVar98 + 0.5) * fVar98 * fVar98;
                  auVar73._12_4_ =
                       fVar99 + fVar70 +
                       (((((fVar99 * 0.00019875691 + 0.0013981999) * fVar99 + 0.008333452) * fVar99
                         + 0.041665796) * fVar99 + 0.16666666) * fVar99 + 0.5) * fVar99 * fVar99;
                  fVar90 = (float)((int)fVar90 * 0x800000 + (int)fVar67) * auVar73._0_4_ + fVar67;
                  fVar92 = (float)((int)fVar92 * 0x800000 + (int)fVar68) * auVar73._4_4_ + fVar68;
                  fVar94 = (float)((int)fVar94 * 0x800000 + (int)fVar69) * auVar73._8_4_ + fVar69;
                  fVar95 = (float)((int)fVar95 * 0x800000 + (int)fVar70) * auVar73._12_4_ + fVar70;
                  auVar29._4_4_ = fVar92;
                  auVar29._0_4_ = fVar90;
                  auVar29._8_4_ = fVar94;
                  auVar29._12_4_ = fVar95;
                  auVar77 = rcpps(auVar73,auVar29);
                  fVar96 = auVar77._0_4_;
                  fVar97 = auVar77._4_4_;
                  fVar98 = auVar77._8_4_;
                  fVar99 = auVar77._12_4_;
                  auVar86._0_4_ =
                       fVar71 * (fVar96 + fVar96 + -1.0 +
                                (2.0 - fVar90 * (fVar96 + fVar96)) * fVar96);
                  auVar86._4_4_ =
                       fVar91 * (fVar97 + fVar97 + -1.0 +
                                (2.0 - fVar92 * (fVar97 + fVar97)) * fVar97);
                  auVar86._8_4_ =
                       fVar83 * (fVar98 + fVar98 + -1.0 +
                                (2.0 - fVar94 * (fVar98 + fVar98)) * fVar98);
                  auVar86._12_4_ =
                       fVar93 * (fVar99 + fVar99 + -1.0 +
                                (2.0 - fVar95 * (fVar99 + fVar99)) * fVar99);
                  break;
                case 6:
                  fVar96 = **(float **)(&this->field_0x118 + (long)p_Var46);
                  fVar97 = (*(float **)(&this->field_0x118 + (long)p_Var46))[1];
                  auVar76._0_4_ = fVar96 * fVar71 + fVar97;
                  auVar76._4_4_ = fVar96 * fVar91 + fVar97;
                  auVar76._8_4_ = fVar96 * fVar83 + fVar97;
                  auVar76._12_4_ = fVar96 * fVar93 + fVar97;
                  auVar77 = maxps(auVar76,auVar77);
                  auVar77 = minps(auVar77,auVar37);
                  auVar86._0_4_ = fVar71 * auVar77._0_4_;
                  auVar86._4_4_ = fVar91 * auVar77._4_4_;
                  auVar86._8_4_ = fVar83 * auVar77._8_4_;
                  auVar86._12_4_ = fVar93 * auVar77._12_4_;
                }
                *pauVar58 = auVar86;
                pauVar58 = pauVar58 + 1;
                uVar48 = uVar48 + 1;
                local_a8 = local_a8 + 1;
              } while (uVar48 != local_98.w);
            }
            iVar39 = local_e8._0_4_ + 1;
            local_e8._0_4_ = iVar39;
          } while (iVar39 != local_98.h);
        }
        local_178 = local_178 + 1;
      } while (local_178 != local_98.c);
      goto LAB_0029a1be;
    }
LAB_0029b290:
    pp_Var53 = this->_vptr_Deconvolution_x86;
  }
  else {
LAB_0029a1be:
    auVar37 = _DAT_00517220;
    auVar31 = _DAT_005171f0;
    auVar85 = _DAT_005171e0;
    if ((iVar9 == 1) && (local_16c == 4)) {
      local_38 = (long)local_98.c;
      if (local_38 < 1) goto LAB_0029b290;
      p_Var46 = local_48[-3];
      iVar62 = *(int *)(&this->field_0xdc + (long)p_Var46);
      iVar44 = *(int *)(&this->field_0xe0 + (long)p_Var46);
      iVar66 = *(int *)(&this->field_0xe4 + (long)p_Var46);
      iVar63 = *(int *)(&this->field_0xe8 + (long)p_Var46);
      uVar12 = *(undefined4 *)(&this->field_0x114 + (long)p_Var46);
      lVar54 = *(long *)(&this->field_0x1a8 + (long)p_Var46);
      uVar13 = *(uint *)(&this->field_0xd4 + (long)p_Var46);
      uVar48 = *(uint *)(&this->field_0xd8 + (long)p_Var46);
      local_190 = 0;
      fVar67 = (float)DAT_00517220;
      fVar68 = DAT_00517220._4_4_;
      fVar69 = DAT_00517220._8_4_;
      fVar70 = DAT_00517220._12_4_;
      do {
        if (0 < local_98.h) {
          iVar43 = bottom_blob->w;
          iVar61 = bottom_blob->h;
          pauVar58 = (undefined1 (*) [16])
                     (local_98.cstep * local_190 *
                      CONCAT44(local_98.elemsize._4_4_,(undefined4)local_98.elemsize) +
                     (long)local_98.data);
          uVar14 = bottom_blob->c;
          auVar36._12_4_ = 0;
          auVar36._0_12_ = local_e8._4_12_;
          local_e8._0_16_ = auVar36 << 0x20;
          do {
            if (0 < local_98.w) {
              uVar60 = 0;
              iVar39 = (1 - uVar13) * iVar62;
              do {
                auVar77 = ZEXT816(0);
                if (lVar54 == 0) {
                  auVar88 = ZEXT816(0);
                }
                else {
                  auVar88 = *(undefined1 (*) [16])(lVar54 + local_190 * 0x10);
                }
                if (0 < (int)uVar14) {
                  pvVar59 = (void *)((this->weight_data_tm).cstep * local_190 *
                                     (this->weight_data_tm).elemsize +
                                    (long)(this->weight_data_tm).data);
                  uVar57 = 0;
                  do {
                    if (0 < (int)uVar48) {
                      uVar64 = 0;
                      uVar65 = 0;
                      do {
                        iVar40 = (((int)uVar65 - uVar48) + 1) * iVar44 + local_e8._0_4_;
                        if ((((-1 < iVar40) && (iVar41 = iVar40 / iVar63, iVar40 % iVar63 == 0)) &&
                            (iVar41 < iVar61)) && (0 < (int)uVar13)) {
                          uVar52 = uVar64;
                          uVar55 = (ulong)uVar13;
                          auVar86 = auVar88;
                          iVar40 = iVar39;
                          do {
                            auVar88 = auVar86;
                            if (((-1 < iVar40) && (iVar42 = iVar40 / iVar66, iVar40 % iVar66 == 0))
                               && (iVar42 < iVar43)) {
                              fVar71 = *(float *)((long)bottom_blob->data +
                                                 (long)iVar42 * 4 +
                                                 (long)iVar41 *
                                                 (long)bottom_blob->w * bottom_blob->elemsize +
                                                 bottom_blob->cstep * bottom_blob->elemsize * uVar57
                                                 );
                              pfVar1 = (float *)((long)pvVar59 + (uVar52 & 0xffffffff) * 4);
                              auVar88._0_4_ = auVar86._0_4_ + fVar71 * *pfVar1;
                              auVar88._4_4_ = auVar86._4_4_ + fVar71 * pfVar1[1];
                              auVar88._8_4_ = auVar86._8_4_ + fVar71 * pfVar1[2];
                              auVar88._12_4_ = auVar86._12_4_ + fVar71 * pfVar1[3];
                            }
                            uVar52 = uVar52 + 4;
                            iVar40 = iVar40 + iVar62;
                            uVar55 = uVar55 - 1;
                            auVar86 = auVar88;
                          } while (uVar55 != 0);
                        }
                        uVar65 = uVar65 + 1;
                        uVar64 = uVar64 + (ulong)uVar13 * 4;
                      } while (uVar65 != uVar48);
                    }
                    pvVar59 = (void *)((long)pvVar59 + (long)(int)(uVar13 * uVar48 * 4) * 4);
                    uVar57 = uVar57 + 1;
                  } while (uVar57 != uVar14);
                }
                fVar71 = auVar88._0_4_;
                fVar91 = auVar88._4_4_;
                fVar83 = auVar88._8_4_;
                fVar93 = auVar88._12_4_;
                switch(uVar12) {
                case 1:
                  auVar88 = maxps(auVar88,auVar77);
                  break;
                case 2:
                  auVar86 = maxps(auVar88,auVar77);
                  auVar77 = minps(auVar88,auVar77);
                  fVar71 = **(float **)(&this->field_0x118 + (long)p_Var46);
                  auVar88._4_4_ = fVar71 * auVar77._4_4_ + auVar86._4_4_;
                  auVar88._0_4_ = fVar71 * auVar77._0_4_ + auVar86._0_4_;
                  auVar88._8_4_ = fVar71 * auVar77._8_4_ + auVar86._8_4_;
                  auVar88._12_4_ = fVar71 * auVar77._12_4_ + auVar86._12_4_;
                  break;
                case 3:
                  uVar5 = **(undefined4 **)(&this->field_0x118 + (long)p_Var46);
                  uVar6 = (*(undefined4 **)(&this->field_0x118 + (long)p_Var46))[1];
                  auVar80._4_4_ = uVar5;
                  auVar80._0_4_ = uVar5;
                  auVar80._8_4_ = uVar5;
                  auVar80._12_4_ = uVar5;
                  auVar77 = maxps(auVar88,auVar80);
                  auVar28._4_4_ = uVar6;
                  auVar28._0_4_ = uVar6;
                  auVar28._8_4_ = uVar6;
                  auVar28._12_4_ = uVar6;
                  auVar88 = minps(auVar77,auVar28);
                  break;
                case 4:
                  auVar89._0_8_ = auVar88._0_8_ ^ 0x8000000080000000;
                  auVar89._8_4_ = -fVar83;
                  auVar89._12_4_ = -fVar93;
                  auVar77 = minps(auVar89,auVar85);
                  auVar77 = maxps(auVar77,auVar31);
                  fVar91 = auVar77._0_4_ * 1.442695 + 0.5;
                  fVar93 = auVar77._4_4_ * 1.442695 + 0.5;
                  fVar97 = auVar77._8_4_ * 1.442695 + 0.5;
                  fVar99 = auVar77._12_4_ * 1.442695 + 0.5;
                  fVar71 = (float)(int)fVar91;
                  fVar83 = (float)(int)fVar93;
                  fVar96 = (float)(int)fVar97;
                  fVar98 = (float)(int)fVar99;
                  fVar71 = fVar71 - (float)(-(uint)(fVar91 < fVar71) & (uint)fVar67);
                  fVar83 = fVar83 - (float)(-(uint)(fVar93 < fVar83) & (uint)fVar68);
                  fVar96 = fVar96 - (float)(-(uint)(fVar97 < fVar96) & (uint)fVar69);
                  fVar98 = fVar98 - (float)(-(uint)(fVar99 < fVar98) & (uint)fVar70);
                  fVar91 = fVar71 * -0.6931472 + auVar77._0_4_;
                  fVar93 = fVar83 * -0.6931472 + auVar77._4_4_;
                  fVar97 = fVar96 * -0.6931472 + auVar77._8_4_;
                  fVar99 = fVar98 * -0.6931472 + auVar77._12_4_;
                  auVar81._0_4_ =
                       fVar91 + fVar67 +
                       (((((fVar91 * 0.00019875691 + 0.0013981999) * fVar91 + 0.008333452) * fVar91
                         + 0.041665796) * fVar91 + 0.16666666) * fVar91 + 0.5) * fVar91 * fVar91;
                  auVar81._4_4_ =
                       fVar93 + fVar68 +
                       (((((fVar93 * 0.00019875691 + 0.0013981999) * fVar93 + 0.008333452) * fVar93
                         + 0.041665796) * fVar93 + 0.16666666) * fVar93 + 0.5) * fVar93 * fVar93;
                  auVar81._8_4_ =
                       fVar97 + fVar69 +
                       (((((fVar97 * 0.00019875691 + 0.0013981999) * fVar97 + 0.008333452) * fVar97
                         + 0.041665796) * fVar97 + 0.16666666) * fVar97 + 0.5) * fVar97 * fVar97;
                  auVar81._12_4_ =
                       fVar99 + fVar70 +
                       (((((fVar99 * 0.00019875691 + 0.0013981999) * fVar99 + 0.008333452) * fVar99
                         + 0.041665796) * fVar99 + 0.16666666) * fVar99 + 0.5) * fVar99 * fVar99;
                  fVar97 = (float)((int)fVar71 * 0x800000 + (int)fVar67) * auVar81._0_4_ + fVar67;
                  fVar99 = (float)((int)fVar83 * 0x800000 + (int)fVar68) * auVar81._4_4_ + fVar68;
                  fVar96 = (float)((int)fVar96 * 0x800000 + (int)fVar69) * auVar81._8_4_ + fVar69;
                  fVar98 = (float)((int)fVar98 * 0x800000 + (int)fVar70) * auVar81._12_4_ + fVar70;
                  auVar27._4_4_ = fVar99;
                  auVar27._0_4_ = fVar97;
                  auVar27._8_4_ = fVar96;
                  auVar27._12_4_ = fVar98;
                  auVar77 = rcpps(auVar81,auVar27);
                  fVar71 = auVar77._0_4_;
                  fVar91 = auVar77._4_4_;
                  fVar83 = auVar77._8_4_;
                  fVar93 = auVar77._12_4_;
                  auVar88._0_4_ = (fVar67 - fVar97 * fVar71) * fVar71 + fVar71;
                  auVar88._4_4_ = (fVar68 - fVar99 * fVar91) * fVar91 + fVar91;
                  auVar88._8_4_ = (fVar69 - fVar96 * fVar83) * fVar83 + fVar83;
                  auVar88._12_4_ = (fVar70 - fVar98 * fVar93) * fVar93 + fVar93;
                  break;
                case 5:
                  auVar77 = minps(auVar88,auVar85);
                  auVar77 = maxps(auVar77,auVar31);
                  fVar96 = auVar77._0_4_ * 1.442695 + 0.5;
                  fVar97 = auVar77._4_4_ * 1.442695 + 0.5;
                  fVar98 = auVar77._8_4_ * 1.442695 + 0.5;
                  fVar99 = auVar77._12_4_ * 1.442695 + 0.5;
                  fVar90 = (float)(int)fVar96;
                  fVar92 = (float)(int)fVar97;
                  fVar94 = (float)(int)fVar98;
                  fVar95 = (float)(int)fVar99;
                  fVar90 = fVar90 - (float)(-(uint)(fVar96 < fVar90) & (uint)fVar67);
                  fVar92 = fVar92 - (float)(-(uint)(fVar97 < fVar92) & (uint)fVar68);
                  fVar94 = fVar94 - (float)(-(uint)(fVar98 < fVar94) & (uint)fVar69);
                  fVar95 = fVar95 - (float)(-(uint)(fVar99 < fVar95) & (uint)fVar70);
                  fVar96 = auVar77._0_4_ - fVar90 * 0.6931472;
                  fVar97 = auVar77._4_4_ - fVar92 * 0.6931472;
                  fVar98 = auVar77._8_4_ - fVar94 * 0.6931472;
                  fVar99 = auVar77._12_4_ - fVar95 * 0.6931472;
                  auVar101._0_4_ =
                       (float)((int)fVar90 * 0x800000 + (int)fVar67) *
                       (fVar96 + fVar67 +
                       (((((fVar96 * 0.00019875691 + 0.0013981999) * fVar96 + 0.008333452) * fVar96
                         + 0.041665796) * fVar96 + 0.16666666) * fVar96 + 0.5) * fVar96 * fVar96) +
                       fVar67;
                  auVar101._4_4_ =
                       (float)((int)fVar92 * 0x800000 + (int)fVar68) *
                       (fVar97 + fVar68 +
                       (((((fVar97 * 0.00019875691 + 0.0013981999) * fVar97 + 0.008333452) * fVar97
                         + 0.041665796) * fVar97 + 0.16666666) * fVar97 + 0.5) * fVar97 * fVar97) +
                       fVar68;
                  auVar101._8_4_ =
                       (float)((int)fVar94 * 0x800000 + (int)fVar69) *
                       (fVar98 + fVar69 +
                       (((((fVar98 * 0.00019875691 + 0.0013981999) * fVar98 + 0.008333452) * fVar98
                         + 0.041665796) * fVar98 + 0.16666666) * fVar98 + 0.5) * fVar98 * fVar98) +
                       fVar69;
                  auVar101._12_4_ =
                       (float)((int)fVar95 * 0x800000 + (int)fVar70) *
                       (fVar99 + fVar70 +
                       (((((fVar99 * 0.00019875691 + 0.0013981999) * fVar99 + 0.008333452) * fVar99
                         + 0.041665796) * fVar99 + 0.16666666) * fVar99 + 0.5) * fVar99 * fVar99) +
                       fVar70;
                  auVar77 = maxps(auVar101,_DAT_00517290);
                  fVar96 = (float)(auVar77._0_4_ & 0x807fffff | 0x3f000000);
                  fVar98 = (float)(auVar77._4_4_ & 0x807fffff | 0x3f000000);
                  fVar90 = (float)(auVar77._8_4_ & 0x807fffff | 0x3f000000);
                  fVar94 = (float)(auVar77._12_4_ & 0x807fffff | 0x3f000000);
                  fVar97 = fVar96 + -1.0 + (float)(-(uint)(fVar96 < 0.70710677) & (uint)fVar96);
                  fVar99 = fVar98 + -1.0 + (float)(-(uint)(fVar98 < 0.70710677) & (uint)fVar98);
                  fVar92 = fVar90 + -1.0 + (float)(-(uint)(fVar90 < 0.70710677) & (uint)fVar90);
                  fVar95 = fVar94 + -1.0 + (float)(-(uint)(fVar94 < 0.70710677) & (uint)fVar94);
                  auVar78._0_8_ =
                       CONCAT44(-(uint)(auVar101._4_4_ <= 0.0),-(uint)(auVar101._0_4_ <= 0.0)) &
                       0x7fffffff7fffffff;
                  auVar78._8_4_ = -(uint)(auVar101._8_4_ <= 0.0) & 0x7fffffff;
                  auVar78._12_4_ = -(uint)(auVar101._12_4_ <= 0.0) & 0x7fffffff;
                  auVar24._4_4_ =
                       ~-(uint)(auVar101._4_4_ <= 0.0) &
                       (uint)((((float)(int)((auVar77._4_4_ >> 0x17) - 0x7e) -
                               (float)(-(uint)(fVar98 < 0.70710677) & (uint)fVar68)) * 0.6931472 +
                               fVar99 + (((((((((fVar99 * 0.070376836 + -0.1151461) * fVar99 +
                                               0.116769984) * fVar99 + -0.12420141) * fVar99 +
                                             0.14249323) * fVar99 + -0.16668057) * fVar99 +
                                           0.20000714) * fVar99 + -0.24999994) * fVar99 + 0.3333333)
                                         * fVar99 + -0.5) * fVar99 * fVar99) * -2.0);
                  auVar24._0_4_ =
                       ~-(uint)(auVar101._0_4_ <= 0.0) &
                       (uint)((((float)(int)((auVar77._0_4_ >> 0x17) - 0x7e) -
                               (float)(-(uint)(fVar96 < 0.70710677) & (uint)fVar67)) * 0.6931472 +
                               fVar97 + (((((((((fVar97 * 0.070376836 + -0.1151461) * fVar97 +
                                               0.116769984) * fVar97 + -0.12420141) * fVar97 +
                                             0.14249323) * fVar97 + -0.16668057) * fVar97 +
                                           0.20000714) * fVar97 + -0.24999994) * fVar97 + 0.3333333)
                                         * fVar97 + -0.5) * fVar97 * fVar97) * -2.0);
                  auVar24._8_4_ =
                       ~-(uint)(auVar101._8_4_ <= 0.0) &
                       (uint)((((float)(int)((auVar77._8_4_ >> 0x17) - 0x7e) -
                               (float)(-(uint)(fVar90 < 0.70710677) & (uint)fVar69)) * 0.6931472 +
                               fVar92 + (((((((((fVar92 * 0.070376836 + -0.1151461) * fVar92 +
                                               0.116769984) * fVar92 + -0.12420141) * fVar92 +
                                             0.14249323) * fVar92 + -0.16668057) * fVar92 +
                                           0.20000714) * fVar92 + -0.24999994) * fVar92 + 0.3333333)
                                         * fVar92 + -0.5) * fVar92 * fVar92) * -2.0);
                  auVar24._12_4_ =
                       ~-(uint)(auVar101._12_4_ <= 0.0) &
                       (uint)((((float)(int)((auVar77._12_4_ >> 0x17) - 0x7e) -
                               (float)(-(uint)(fVar94 < 0.70710677) & (uint)fVar70)) * 0.6931472 +
                               fVar95 + (((((((((fVar95 * 0.070376836 + -0.1151461) * fVar95 +
                                               0.116769984) * fVar95 + -0.12420141) * fVar95 +
                                             0.14249323) * fVar95 + -0.16668057) * fVar95 +
                                           0.20000714) * fVar95 + -0.24999994) * fVar95 + 0.3333333)
                                         * fVar95 + -0.5) * fVar95 * fVar95) * -2.0);
                  auVar77 = minps(auVar78 | auVar24,auVar85);
                  auVar77 = maxps(auVar77,auVar31);
                  fVar96 = auVar77._0_4_ * 1.442695 + 0.5;
                  fVar97 = auVar77._4_4_ * 1.442695 + 0.5;
                  fVar98 = auVar77._8_4_ * 1.442695 + 0.5;
                  fVar99 = auVar77._12_4_ * 1.442695 + 0.5;
                  fVar90 = (float)(int)fVar96;
                  fVar92 = (float)(int)fVar97;
                  fVar94 = (float)(int)fVar98;
                  fVar95 = (float)(int)fVar99;
                  fVar90 = fVar90 - (float)(-(uint)(fVar96 < fVar90) & (uint)fVar67);
                  fVar92 = fVar92 - (float)(-(uint)(fVar97 < fVar92) & (uint)fVar68);
                  fVar94 = fVar94 - (float)(-(uint)(fVar98 < fVar94) & (uint)fVar69);
                  fVar95 = fVar95 - (float)(-(uint)(fVar99 < fVar95) & (uint)fVar70);
                  fVar96 = auVar77._0_4_ - fVar90 * 0.6931472;
                  fVar97 = auVar77._4_4_ - fVar92 * 0.6931472;
                  fVar98 = auVar77._8_4_ - fVar94 * 0.6931472;
                  fVar99 = auVar77._12_4_ - fVar95 * 0.6931472;
                  auVar79._0_4_ =
                       fVar96 + fVar67 +
                       (((((fVar96 * 0.00019875691 + 0.0013981999) * fVar96 + 0.008333452) * fVar96
                         + 0.041665796) * fVar96 + 0.16666666) * fVar96 + 0.5) * fVar96 * fVar96;
                  auVar79._4_4_ =
                       fVar97 + fVar68 +
                       (((((fVar97 * 0.00019875691 + 0.0013981999) * fVar97 + 0.008333452) * fVar97
                         + 0.041665796) * fVar97 + 0.16666666) * fVar97 + 0.5) * fVar97 * fVar97;
                  auVar79._8_4_ =
                       fVar98 + fVar69 +
                       (((((fVar98 * 0.00019875691 + 0.0013981999) * fVar98 + 0.008333452) * fVar98
                         + 0.041665796) * fVar98 + 0.16666666) * fVar98 + 0.5) * fVar98 * fVar98;
                  auVar79._12_4_ =
                       fVar99 + fVar70 +
                       (((((fVar99 * 0.00019875691 + 0.0013981999) * fVar99 + 0.008333452) * fVar99
                         + 0.041665796) * fVar99 + 0.16666666) * fVar99 + 0.5) * fVar99 * fVar99;
                  fVar90 = (float)((int)fVar90 * 0x800000 + (int)fVar67) * auVar79._0_4_ + fVar67;
                  fVar92 = (float)((int)fVar92 * 0x800000 + (int)fVar68) * auVar79._4_4_ + fVar68;
                  fVar94 = (float)((int)fVar94 * 0x800000 + (int)fVar69) * auVar79._8_4_ + fVar69;
                  fVar95 = (float)((int)fVar95 * 0x800000 + (int)fVar70) * auVar79._12_4_ + fVar70;
                  auVar30._4_4_ = fVar92;
                  auVar30._0_4_ = fVar90;
                  auVar30._8_4_ = fVar94;
                  auVar30._12_4_ = fVar95;
                  auVar77 = rcpps(auVar79,auVar30);
                  fVar96 = auVar77._0_4_;
                  fVar97 = auVar77._4_4_;
                  fVar98 = auVar77._8_4_;
                  fVar99 = auVar77._12_4_;
                  auVar88._0_4_ =
                       fVar71 * (fVar96 + fVar96 + -1.0 +
                                (2.0 - fVar90 * (fVar96 + fVar96)) * fVar96);
                  auVar88._4_4_ =
                       fVar91 * (fVar97 + fVar97 + -1.0 +
                                (2.0 - fVar92 * (fVar97 + fVar97)) * fVar97);
                  auVar88._8_4_ =
                       fVar83 * (fVar98 + fVar98 + -1.0 +
                                (2.0 - fVar94 * (fVar98 + fVar98)) * fVar98);
                  auVar88._12_4_ =
                       fVar93 * (fVar99 + fVar99 + -1.0 +
                                (2.0 - fVar95 * (fVar99 + fVar99)) * fVar99);
                  break;
                case 6:
                  fVar96 = **(float **)(&this->field_0x118 + (long)p_Var46);
                  fVar97 = (*(float **)(&this->field_0x118 + (long)p_Var46))[1];
                  auVar82._0_4_ = fVar96 * fVar71 + fVar97;
                  auVar82._4_4_ = fVar96 * fVar91 + fVar97;
                  auVar82._8_4_ = fVar96 * fVar83 + fVar97;
                  auVar82._12_4_ = fVar96 * fVar93 + fVar97;
                  auVar77 = maxps(auVar82,auVar77);
                  auVar77 = minps(auVar77,auVar37);
                  auVar88._0_4_ = fVar71 * auVar77._0_4_;
                  auVar88._4_4_ = fVar91 * auVar77._4_4_;
                  auVar88._8_4_ = fVar83 * auVar77._8_4_;
                  auVar88._12_4_ = fVar93 * auVar77._12_4_;
                }
                *pauVar58 = auVar88;
                pauVar58 = pauVar58 + 1;
                uVar60 = uVar60 + 1;
                iVar39 = iVar39 + 1;
              } while (uVar60 != local_98.w);
            }
            iVar39 = local_e8._0_4_ + 1;
            local_e8._0_4_ = iVar39;
          } while (iVar39 != local_98.h);
        }
        local_190 = local_190 + 1;
      } while (local_190 != local_38);
    }
    if ((iVar9 == 4) && (local_16c == 1)) {
      lVar54 = (long)local_98.c;
      if (0 < lVar54) {
        p_Var46 = local_48[-3];
        iVar9 = *(int *)(&this->field_0xdc + (long)p_Var46);
        iVar62 = *(int *)(&this->field_0xe0 + (long)p_Var46);
        iVar44 = *(int *)(&this->field_0xe4 + (long)p_Var46);
        iVar66 = *(int *)(&this->field_0xe8 + (long)p_Var46);
        uVar12 = *(undefined4 *)(&this->field_0x114 + (long)p_Var46);
        lVar50 = *(long *)(&this->field_0x1a8 + (long)p_Var46);
        uVar10 = *(uint *)(&this->field_0xd4 + (long)p_Var46);
        uVar11 = *(uint *)(&this->field_0xd8 + (long)p_Var46);
        local_50 = CONCAT44(local_98.elemsize._4_4_,(undefined4)local_98.elemsize) * local_98.cstep;
        iVar63 = bottom_blob->w;
        iVar43 = bottom_blob->h;
        uVar13 = bottom_blob->c;
        local_178 = 0;
        do {
          if (0 < iVar8) {
            sVar17 = (this->weight_data_tm).cstep;
            sVar18 = (this->weight_data_tm).elemsize;
            local_148 = (float *)(local_50 * local_178 + (long)pvVar38);
            pvVar59 = (this->weight_data_tm).data;
            iVar61 = 0;
            do {
              if (0 < iVar7) {
                iVar39 = bottom_blob->w;
                pvVar16 = bottom_blob->data;
                sVar19 = bottom_blob->elemsize;
                sVar20 = bottom_blob->cstep;
                pfVar1 = *(float **)(&this->field_0x118 + (long)p_Var46);
                uVar48 = 0;
                iVar47 = (1 - uVar10) * iVar9;
                do {
                  if (lVar50 == 0) {
                    fVar67 = 0.0;
                  }
                  else {
                    fVar67 = *(float *)(lVar50 + local_178 * 4);
                  }
                  if ((int)uVar13 < 1) {
                    fVar68 = 0.0;
                    fVar69 = 0.0;
                    fVar70 = 0.0;
                    fVar71 = 0.0;
                  }
                  else {
                    fVar68 = 0.0;
                    fVar69 = 0.0;
                    fVar70 = 0.0;
                    fVar71 = 0.0;
                    uVar57 = 0;
                    pvVar56 = (void *)(sVar17 * local_178 * sVar18 + (long)pvVar59);
                    do {
                      if (0 < (int)uVar11) {
                        uVar65 = 0;
                        uVar64 = 0;
                        do {
                          iVar40 = (((int)uVar64 - uVar11) + 1) * iVar62 + iVar61;
                          if ((((-1 < iVar40) && (iVar41 = iVar40 / iVar66, iVar40 % iVar66 == 0))
                              && (0 < (int)uVar10)) && (iVar41 < iVar43)) {
                            uVar52 = (ulong)uVar10;
                            uVar55 = uVar65;
                            iVar40 = iVar47;
                            do {
                              if (((-1 < iVar40) && (iVar42 = iVar40 / iVar44, iVar40 % iVar44 == 0)
                                  ) && (iVar42 < iVar63)) {
                                pfVar2 = (float *)((long)pvVar56 + (uVar55 & 0xffffffff) * 4);
                                pfVar3 = (float *)((long)pvVar16 +
                                                  (long)(iVar42 << 2) * 4 +
                                                  (long)iVar41 * (long)iVar39 * sVar19 +
                                                  sVar20 * sVar19 * uVar57);
                                fVar68 = fVar68 + *pfVar2 * *pfVar3;
                                fVar69 = fVar69 + pfVar2[1] * pfVar3[1];
                                fVar70 = fVar70 + pfVar2[2] * pfVar3[2];
                                fVar71 = fVar71 + pfVar2[3] * pfVar3[3];
                              }
                              uVar55 = uVar55 + 4;
                              iVar40 = iVar40 + iVar9;
                              uVar52 = uVar52 - 1;
                            } while (uVar52 != 0);
                          }
                          uVar64 = uVar64 + 1;
                          uVar65 = uVar65 + (ulong)uVar10 * 4;
                        } while (uVar64 != uVar11);
                      }
                      pvVar56 = (void *)((long)pvVar56 + (long)(int)(uVar10 * uVar11 * 4) * 4);
                      uVar57 = uVar57 + 1;
                    } while (uVar57 != uVar13);
                  }
                  fVar68 = fVar71 + fVar69 + fVar67 + fVar70 + fVar68;
                  fVar67 = fVar68;
                  switch(uVar12) {
                  case 1:
                    if (fVar68 <= 0.0) {
                      fVar67 = 0.0;
                    }
                    break;
                  case 2:
                    fVar67 = (float)(~-(uint)(0.0 < fVar68) & (uint)*pfVar1 |
                                    -(uint)(0.0 < fVar68) & 0x3f800000) * fVar68;
                    break;
                  case 3:
                    if (fVar68 <= *pfVar1) {
                      fVar68 = *pfVar1;
                    }
                    fVar67 = fVar68;
                    if (pfVar1[1] < fVar68) {
                      fVar67 = pfVar1[1];
                    }
                    break;
                  case 4:
                    if (88.37626 <= fVar68) {
                      fVar68 = 88.37626;
                    }
                    fVar67 = expf((float)(-(uint)(fVar68 < -88.37626) & 0x42b0c0a5 |
                                         ~-(uint)(fVar68 < -88.37626) & (uint)-fVar68));
                    fVar67 = 1.0 / (fVar67 + 1.0);
                    break;
                  case 5:
                    fVar67 = expf(fVar68);
                    fVar67 = logf(fVar67 + 1.0);
                    fVar67 = tanhf(fVar67);
                    fVar67 = fVar67 * fVar68;
                    break;
                  case 6:
                    fVar69 = *pfVar1;
                    fVar70 = -pfVar1[1] / fVar69;
                    fVar67 = 0.0;
                    if ((fVar70 <= fVar68) && (fVar67 = fVar68, fVar68 <= fVar70 + 1.0 / fVar69)) {
                      fVar67 = (fVar69 * fVar68 + pfVar1[1]) * fVar68;
                    }
                  }
                  *local_148 = fVar67;
                  local_148 = local_148 + 1;
                  uVar48 = uVar48 + 1;
                  iVar47 = iVar47 + 1;
                } while (uVar48 != iVar7);
              }
              iVar61 = iVar61 + 1;
            } while (iVar61 != iVar8);
          }
          local_178 = local_178 + 1;
        } while (local_178 != lVar54);
      }
      goto LAB_0029b290;
    }
    pp_Var53 = this->_vptr_Deconvolution_x86;
    if (((iVar9 == 1) && (local_16c == 1)) &&
       (p_Var46 = pp_Var53[-3], 0 < *(int *)(&this->field_0xd0 + (long)p_Var46))) {
      lVar54 = local_98.cstep * CONCAT44(local_98.elemsize._4_4_,(undefined4)local_98.elemsize);
      iVar9 = bottom_blob->w;
      iVar62 = bottom_blob->h;
      uVar13 = bottom_blob->c;
      uVar57 = (ulong)(uint)local_98.w;
      lVar50 = (long)local_98.w;
      local_50 = CONCAT44(local_50._4_4_,-(int)local_50);
      local_168 = 0;
      do {
        if (0 < iVar8) {
          local_198 = (void *)(lVar54 * local_168 + (long)pvVar38);
          pp_Var21 = this->_vptr_Deconvolution_x86;
          sVar17 = (this->weight_data_tm).cstep;
          sVar18 = (this->weight_data_tm).elemsize;
          pvVar59 = (this->weight_data_tm).data;
          iVar44 = 0;
          do {
            if (0 < iVar7) {
              iVar66 = bottom_blob->w;
              pvVar16 = bottom_blob->data;
              sVar19 = bottom_blob->elemsize;
              sVar20 = bottom_blob->cstep;
              pp_Var22 = this->_vptr_Deconvolution_x86;
              local_f8 = local_50 & 0xffffffff;
              uVar64 = 0;
              do {
                p_Var46 = pp_Var21[-3];
                if (*(int *)(&this->field_0x10c + (long)p_Var46) == 0) {
                  auVar84 = ZEXT812(0);
                }
                else {
                  auVar84._4_8_ = 0;
                  auVar84._0_4_ =
                       *(uint *)(*(long *)(&this->field_0x1a8 + (long)p_Var46) + local_168 * 4);
                }
                auVar85._12_4_ = 0;
                auVar85._0_12_ = auVar84;
                if (0 < (int)uVar13) {
                  p_Var49 = pp_Var22[-3];
                  local_e8._0_8_ = (void *)(sVar17 * sVar18 * local_168 + (long)pvVar59);
                  uVar65 = 0;
                  do {
                    if (0 < *(int *)(&this->field_0xd8 + (long)p_Var49)) {
                      iVar63 = 0;
                      do {
                        iVar43 = *(int *)(&this->field_0xe0 + (long)p_Var49) * iVar63 +
                                 (iVar44 - iVar47);
                        if (((-1 < iVar43) &&
                            (iVar61 = iVar43 / *(int *)(&this->field_0xe8 + (long)p_Var49),
                            iVar43 % *(int *)(&this->field_0xe8 + (long)p_Var49) == 0)) &&
                           (iVar61 < iVar62)) {
                          iVar43 = *(int *)(&this->field_0xd4 + (long)p_Var49);
                          if (0 < (long)iVar43) {
                            lVar45 = 0;
                            iVar39 = (int)local_f8;
                            do {
                              if (((-1 < iVar39) &&
                                  (iVar40 = iVar39 / *(int *)(&this->field_0xe4 + (long)p_Var49),
                                  iVar39 % *(int *)(&this->field_0xe4 + (long)p_Var49) == 0)) &&
                                 (iVar40 < iVar9)) {
                                auVar85._0_4_ =
                                     auVar85._0_4_ +
                                     *(float *)(local_e8._0_8_ + (ulong)(uint)(iVar43 * iVar63) * 4
                                               + lVar45 * 4) *
                                     *(float *)((long)pvVar16 +
                                               (long)iVar40 * 4 +
                                               (long)iVar61 * (long)iVar66 * sVar19 +
                                               sVar20 * sVar19 * uVar65);
                              }
                              lVar45 = lVar45 + 1;
                              iVar39 = iVar39 + *(int *)(&this->field_0xdc + (long)p_Var49);
                            } while (iVar43 != lVar45);
                          }
                        }
                        iVar63 = iVar63 + 1;
                      } while (iVar63 != *(int *)(&this->field_0xd8 + (long)p_Var49));
                    }
                    uVar65 = uVar65 + 1;
                    local_e8._0_8_ = local_e8._0_8_ + (long)(int)(uVar11 * uVar10) * 4;
                  } while (uVar65 != uVar13);
                }
                fVar67 = auVar85._0_4_;
                switch(*(undefined4 *)(&this->field_0x114 + (long)p_Var46)) {
                case 1:
                  if (fVar67 <= 0.0) {
                    auVar31._12_4_ = 0;
                    auVar31._0_12_ = auVar85._4_12_;
                    auVar85 = auVar31 << 0x20;
                  }
                default:
switchD_0029b0dc_default:
                  fVar70 = auVar85._0_4_;
                  break;
                case 2:
                  fVar70 = (float)(-(uint)(0.0 < fVar67) & 0x3f800000 |
                                  ~-(uint)(0.0 < fVar67) &
                                  **(uint **)(&this->field_0x118 + (long)p_Var46)) * fVar67;
                  break;
                case 3:
                  fVar68 = **(float **)(&this->field_0x118 + (long)p_Var46);
                  if (fVar67 <= fVar68) {
                    auVar85._0_4_ = fVar68;
                  }
                  fVar67 = (*(float **)(&this->field_0x118 + (long)p_Var46))[1];
                  fVar70 = auVar85._0_4_;
                  if (fVar67 < auVar85._0_4_) {
                    fVar70 = fVar67;
                  }
                  break;
                case 4:
                  if (88.37626 <= fVar67) {
                    fVar67 = 88.37626;
                  }
                  fVar67 = expf((float)(-(uint)(fVar67 < -88.37626) & 0x42b0c0a5 |
                                       ~-(uint)(fVar67 < -88.37626) & (uint)-fVar67));
                  fVar70 = 1.0 / (fVar67 + 1.0);
                  break;
                case 5:
                  fVar68 = expf(fVar67);
                  fVar68 = logf(fVar68 + 1.0);
                  fVar70 = tanhf(fVar68);
                  fVar70 = fVar70 * fVar67;
                  local_e8._0_16_ = auVar85;
                  break;
                case 6:
                  fVar68 = **(float **)(&this->field_0x118 + (long)p_Var46);
                  fVar69 = (*(float **)(&this->field_0x118 + (long)p_Var46))[1];
                  fVar71 = -fVar69 / fVar68;
                  fVar70 = 0.0;
                  if (fVar71 <= fVar67) {
                    if (fVar71 + 1.0 / fVar68 < fVar67) goto switchD_0029b0dc_default;
                    fVar70 = (fVar68 * fVar67 + fVar69) * fVar67;
                  }
                }
                *(float *)((long)local_198 + uVar64 * 4) = fVar70;
                uVar64 = uVar64 + 1;
                local_f8 = (ulong)((int)local_f8 + 1);
              } while (uVar64 != uVar57);
            }
            local_198 = (void *)((long)local_198 + lVar50 * 4);
            iVar44 = iVar44 + 1;
          } while (iVar44 != iVar8);
          p_Var46 = pp_Var53[-3];
        }
        local_168 = local_168 + 1;
      } while (local_168 < *(int *)(&this->field_0xd0 + (long)p_Var46));
      goto LAB_0029b290;
    }
  }
  Deconvolution::cut_padding
            ((Deconvolution *)((long)&this->_vptr_Deconvolution_x86 + (long)pp_Var53[-3]),&local_98,
             top_blob,local_40);
  if ((top_blob->data == (void *)0x0) || (iVar62 = 0, (long)top_blob->c * top_blob->cstep == 0)) {
    iVar62 = -100;
  }
LAB_0029b2d4:
  piVar15 = (int *)CONCAT44(local_98.refcount._4_4_,local_98.refcount._0_4_);
  if (piVar15 != (int *)0x0) {
    LOCK();
    *piVar15 = *piVar15 + -1;
    UNLOCK();
    if (*piVar15 == 0) {
      if (local_98.allocator == (Allocator *)0x0) {
        if (local_98.data != (void *)0x0) {
          free(local_98.data);
        }
      }
      else {
        (*(local_98.allocator)->_vptr_Allocator[3])();
      }
    }
  }
  return iVar62;
}

Assistant:

int Deconvolution_x86::forward(const Mat& bottom_blob, Mat& top_blob, const Option& opt) const
{
    // deconvolv with NxN kernel
    // value = value + bias

    int w = bottom_blob.w;
    int h = bottom_blob.h;
    size_t elemsize = bottom_blob.elemsize;
    int elempack = bottom_blob.elempack;

    //     NCNN_LOGE("Deconvolution input %d x %d  pad = %d %d  ksize=%d %d  stride=%d %d", w, h, pad_w, pad_h, kernel_w, kernel_h, stride_w, stride_h);

    const int kernel_extent_w = dilation_w * (kernel_w - 1) + 1;
    const int kernel_extent_h = dilation_h * (kernel_h - 1) + 1;

    int outw = (w - 1) * stride_w + kernel_extent_w + output_pad_right;
    int outh = (h - 1) * stride_h + kernel_extent_h + output_pad_bottom;
    int out_elempack = 1;
#if __SSE2__
    if (opt.use_packing_layout)
    {
#if __AVX512F__
        out_elempack = num_output % 16 == 0 ? 16 : num_output % 8 == 0 ? 8 : num_output % 4 == 0 ? 4 : 1;
#elif __AVX__
        out_elempack = num_output % 8 == 0 ? 8 : num_output % 4 == 0 ? 4 : 1;
#else
        out_elempack = num_output % 4 == 0 ? 4 : 1;
#endif
    }
#endif // __SSE2__
    size_t out_elemsize = elemsize / elempack * out_elempack;

    Mat top_blob_bordered;
    if (pad_left > 0 || pad_right > 0 || pad_top > 0 || pad_bottom > 0 || (output_w > 0 && output_h > 0))
    {
        top_blob_bordered.create(outw, outh, num_output / out_elempack, out_elemsize, out_elempack, opt.workspace_allocator);
    }
    else
    {
        top_blob_bordered = top_blob;
        top_blob_bordered.create(outw, outh, num_output / out_elempack, out_elemsize, out_elempack, opt.blob_allocator);
    }
    if (top_blob_bordered.empty())
        return -100;

    const int maxk = kernel_w * kernel_h;

#if __SSE2__
#if __AVX__
#if __AVX512F__
    if (elempack == 16 && out_elempack == 16)
    {
        {
            deconvolution_pack16_avx512(bottom_blob, top_blob_bordered, weight_data_tm, bias_data, kernel_w, kernel_h, dilation_w, dilation_h, stride_w, stride_h, activation_type, activation_params, opt);
        }
    }

    if (elempack == 8 && out_elempack == 16)
    {
        {
            deconvolution_pack8to16_avx512(bottom_blob, top_blob_bordered, weight_data_tm, bias_data, kernel_w, kernel_h, dilation_w, dilation_h, stride_w, stride_h, activation_type, activation_params, opt);
        }
    }

    if (elempack == 16 && out_elempack == 8)
    {
        {
            deconvolution_pack16to8_avx512(bottom_blob, top_blob_bordered, weight_data_tm, bias_data, kernel_w, kernel_h, dilation_w, dilation_h, stride_w, stride_h, activation_type, activation_params, opt);
        }
    }

    if (elempack == 4 && out_elempack == 16)
    {
        {
            deconvolution_pack4to16_avx512(bottom_blob, top_blob_bordered, weight_data_tm, bias_data, kernel_w, kernel_h, dilation_w, dilation_h, stride_w, stride_h, activation_type, activation_params, opt);
        }
    }

    if (elempack == 16 && out_elempack == 4)
    {
        {
            deconvolution_pack16to4_avx512(bottom_blob, top_blob_bordered, weight_data_tm, bias_data, kernel_w, kernel_h, dilation_w, dilation_h, stride_w, stride_h, activation_type, activation_params, opt);
        }
    }

    if (elempack == 1 && out_elempack == 16)
    {
        {
            deconvolution_pack1to16_avx512(bottom_blob, top_blob_bordered, weight_data_tm, bias_data, kernel_w, kernel_h, dilation_w, dilation_h, stride_w, stride_h, activation_type, activation_params, opt);
        }
    }

    if (elempack == 16 && out_elempack == 1)
    {
        {
            deconvolution_pack16to1_avx512(bottom_blob, top_blob_bordered, weight_data_tm, bias_data, kernel_w, kernel_h, dilation_w, dilation_h, stride_w, stride_h, activation_type, activation_params, opt);
        }
    }
#endif // __AVX512F__

    if (elempack == 8 && out_elempack == 8)
    {
        {
            deconvolution_pack8_avx(bottom_blob, top_blob_bordered, weight_data_tm, bias_data, kernel_w, kernel_h, dilation_w, dilation_h, stride_w, stride_h, activation_type, activation_params, opt);
        }
    }

    if (elempack == 4 && out_elempack == 8)
    {
        {
            deconvolution_pack4to8_avx(bottom_blob, top_blob_bordered, weight_data_tm, bias_data, kernel_w, kernel_h, dilation_w, dilation_h, stride_w, stride_h, activation_type, activation_params, opt);
        }
    }

    if (elempack == 8 && out_elempack == 4)
    {
        {
            deconvolution_pack8to4_avx(bottom_blob, top_blob_bordered, weight_data_tm, bias_data, kernel_w, kernel_h, dilation_w, dilation_h, stride_w, stride_h, activation_type, activation_params, opt);
        }
    }

    if (elempack == 1 && out_elempack == 8)
    {
        {
            deconvolution_pack1to8_avx(bottom_blob, top_blob_bordered, weight_data_tm, bias_data, kernel_w, kernel_h, dilation_w, dilation_h, stride_w, stride_h, activation_type, activation_params, opt);
        }
    }

    if (elempack == 8 && out_elempack == 1)
    {
        {
            deconvolution_pack8to1_avx(bottom_blob, top_blob_bordered, weight_data_tm, bias_data, kernel_w, kernel_h, dilation_w, dilation_h, stride_w, stride_h, activation_type, activation_params, opt);
        }
    }
#endif // __AVX__

    if (elempack == 4 && out_elempack == 4)
    {
        {
            deconvolution_pack4_sse(bottom_blob, top_blob_bordered, weight_data_tm, bias_data, kernel_w, kernel_h, dilation_w, dilation_h, stride_w, stride_h, activation_type, activation_params, opt);
        }
    }

    if (elempack == 1 && out_elempack == 4)
    {
        {
            deconvolution_pack1to4_sse(bottom_blob, top_blob_bordered, weight_data_tm, bias_data, kernel_w, kernel_h, dilation_w, dilation_h, stride_w, stride_h, activation_type, activation_params, opt);
        }
    }

    if (elempack == 4 && out_elempack == 1)
    {
        {
            deconvolution_pack4to1_sse(bottom_blob, top_blob_bordered, weight_data_tm, bias_data, kernel_w, kernel_h, dilation_w, dilation_h, stride_w, stride_h, activation_type, activation_params, opt);
        }
    }
#endif // __SSE2__

    if (elempack == 1 && out_elempack == 1)
    {
        {
            // num_output
            #pragma omp parallel for num_threads(opt.num_threads)
            for (int p = 0; p < num_output; p++)
            {
                float* outptr = top_blob_bordered.channel(p);

                // shadowed variable for less openmp task args
                const int w = bottom_blob.w;
                const int h = bottom_blob.h;
                const int channels = bottom_blob.c;
                const int outw = top_blob_bordered.w;
                const int outh = top_blob_bordered.h;

                for (int i = 0; i < outh; i++)
                {
                    for (int j = 0; j < outw; j++)
                    {
                        float sum = 0.f;

                        if (bias_term)
                        {
                            sum = bias_data[p];
                        }

                        const float* kptr = (const float*)weight_data_tm.channel(p);

                        // channels
                        for (int q = 0; q < channels; q++)
                        {
                            const Mat m = bottom_blob.channel(q);

                            for (int y = 0; y < kernel_h; y++)
                            {
                                int sys = (i + y * dilation_h - (kernel_extent_h - 1));
                                if (sys < 0 || sys % stride_h != 0)
                                    continue;

                                int sy = sys / stride_h;
                                if (sy >= h)
                                    continue;

                                const float* sptr = m.row(sy);

                                for (int x = 0; x < kernel_w; x++)
                                {
                                    int sxs = (j + x * dilation_w - (kernel_extent_w - 1));
                                    if (sxs < 0 || sxs % stride_w != 0)
                                        continue;

                                    int sx = sxs / stride_w;
                                    if (sx >= w)
                                        continue;

                                    float val = sptr[sx];

                                    int k = y * kernel_w + x;

                                    float w = kptr[k];

                                    sum += val * w;
                                }
                            }

                            kptr += maxk;
                        }

                        sum = activation_ss(sum, activation_type, activation_params);

                        outptr[j] = sum;
                    }

                    outptr += outw;
                }
            }
        }
    }

    cut_padding(top_blob_bordered, top_blob, opt);
    if (top_blob.empty())
        return -100;

    return 0;
}